

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall deqp::egl::GLES2ThreadTest::DeleteTexture::exec(DeleteTexture *this,Thread *t)

{
  ostream *poVar1;
  deUint32 err;
  Thread *pTVar2;
  GLuint tex;
  GLuint local_1b4;
  undefined1 local_1b0 [136];
  ios_base local_128 [264];
  
  pTVar2 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar2 != (Thread *)0x0) {
    local_1b4 = ((this->m_texture).m_ptr)->texture;
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glDeleteTextures(1, { ",0x1f);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," })",3);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0x480))(1,&local_1b4);
    err = (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"deleteTextures(1, &tex)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x3ab);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x18),"End -- glDeleteTextures()",0x19);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    ((this->m_texture).m_ptr)->texture = 0;
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void DeleteTexture::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint tex = m_texture->texture;

	thread.newMessage() << "Begin -- glDeleteTextures(1, { " << tex << " })" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, deleteTextures(1, &tex));
	thread.newMessage() << "End -- glDeleteTextures()" << tcu::ThreadUtil::Message::End;

	m_texture->texture = 0;
}